

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Data * fts5DataRead(Fts5Index *p,i64 iRowid)

{
  undefined8 uVar1;
  u16 uVar2;
  int iVar3;
  long in_RDI;
  int unaff_retaddr;
  sqlite_int64 in_stack_00000008;
  sqlite3_int64 nAlloc;
  int szData;
  int nByte;
  u8 *aOut;
  Fts5Config *pConfig;
  sqlite3_blob *pBlob;
  int rc;
  Fts5Data *pRet;
  sqlite3_blob **in_stack_000001f0;
  void *in_stack_ffffffffffffffa8;
  Fts5Index *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc4;
  sqlite3_blob *in_stack_ffffffffffffffc8;
  int local_1c;
  Fts5Data *local_18;
  
  local_18 = (Fts5Data *)0x0;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    local_1c = 0;
    if (*(long *)(in_RDI + 0x48) != 0) {
      uVar1 = *(undefined8 *)(in_RDI + 0x48);
      *(undefined8 *)(in_RDI + 0x48) = 0;
      local_1c = sqlite3_blob_reopen(in_stack_ffffffffffffffc8,
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(undefined8 *)(in_RDI + 0x48) = uVar1;
      if (local_1c != 0) {
        fts5IndexCloseReader(in_stack_ffffffffffffffb0);
      }
      if (local_1c == 4) {
        local_1c = 0;
      }
    }
    if ((*(long *)(in_RDI + 0x48) == 0) && (local_1c == 0)) {
      in_stack_ffffffffffffffa8 = (void *)(in_RDI + 0x48);
      local_1c = sqlite3_blob_open((sqlite3 *)pConfig,(char *)aOut,_szData,(char *)nAlloc,
                                   in_stack_00000008,unaff_retaddr,in_stack_000001f0);
    }
    if (local_1c == 1) {
      local_1c = 0x10b;
    }
    if (local_1c == 0) {
      iVar3 = sqlite3_blob_bytes(*(sqlite3_blob **)(in_RDI + 0x48));
      iVar4 = 0x10;
      local_18 = (Fts5Data *)sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffffa8);
      if (local_18 == (Fts5Data *)0x0) {
        local_1c = 7;
      }
      else {
        local_18->nn = iVar3;
        local_18->p = (u8 *)((long)&local_18->p + (long)iVar4);
      }
      if (local_1c == 0) {
        local_1c = sqlite3_blob_read((sqlite3_blob *)in_stack_ffffffffffffffb0,
                                     in_stack_ffffffffffffffa8,0,0x27111d);
      }
      if (local_1c == 0) {
        local_18->p[iVar3] = '\0';
        local_18->p[iVar3 + 1] = '\0';
        uVar2 = fts5GetU16(local_18->p + 2);
        local_18->szLeaf = (uint)uVar2;
      }
      else {
        sqlite3_free((void *)0x271132);
        local_18 = (Fts5Data *)0x0;
      }
    }
    *(int *)(in_RDI + 0x3c) = local_1c;
    *(int *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) + 1;
  }
  return local_18;
}

Assistant:

static Fts5Data *fts5DataRead(Fts5Index *p, i64 iRowid){
  Fts5Data *pRet = 0;
  if( p->rc==SQLITE_OK ){
    int rc = SQLITE_OK;

    if( p->pReader ){
      /* This call may return SQLITE_ABORT if there has been a savepoint
      ** rollback since it was last used. In this case a new blob handle
      ** is required.  */
      sqlite3_blob *pBlob = p->pReader;
      p->pReader = 0;
      rc = sqlite3_blob_reopen(pBlob, iRowid);
      assert( p->pReader==0 );
      p->pReader = pBlob;
      if( rc!=SQLITE_OK ){
        fts5IndexCloseReader(p);
      }
      if( rc==SQLITE_ABORT ) rc = SQLITE_OK;
    }

    /* If the blob handle is not open at this point, open it and seek
    ** to the requested entry.  */
    if( p->pReader==0 && rc==SQLITE_OK ){
      Fts5Config *pConfig = p->pConfig;
      rc = sqlite3_blob_open(pConfig->db,
          pConfig->zDb, p->zDataTbl, "block", iRowid, 0, &p->pReader
      );
    }

    /* If either of the sqlite3_blob_open() or sqlite3_blob_reopen() calls
    ** above returned SQLITE_ERROR, return SQLITE_CORRUPT_VTAB instead.
    ** All the reasons those functions might return SQLITE_ERROR - missing
    ** table, missing row, non-blob/text in block column - indicate
    ** backing store corruption.  */
    if( rc==SQLITE_ERROR ) rc = FTS5_CORRUPT;

    if( rc==SQLITE_OK ){
      u8 *aOut = 0;               /* Read blob data into this buffer */
      int nByte = sqlite3_blob_bytes(p->pReader);
      int szData = (sizeof(Fts5Data) + 7) & ~7;
      sqlite3_int64 nAlloc = szData + nByte + FTS5_DATA_PADDING;
      pRet = (Fts5Data*)sqlite3_malloc64(nAlloc);
      if( pRet ){
        pRet->nn = nByte;
        aOut = pRet->p = (u8*)pRet + szData;
      }else{
        rc = SQLITE_NOMEM;
      }

      if( rc==SQLITE_OK ){
        rc = sqlite3_blob_read(p->pReader, aOut, nByte, 0);
      }
      if( rc!=SQLITE_OK ){
        sqlite3_free(pRet);
        pRet = 0;
      }else{
        /* TODO1: Fix this */
        pRet->p[nByte] = 0x00;
        pRet->p[nByte+1] = 0x00;
        pRet->szLeaf = fts5GetU16(&pRet->p[2]);
      }
    }
    p->rc = rc;
    p->nRead++;
  }

  assert( (pRet==0)==(p->rc!=SQLITE_OK) );
  assert( pRet==0 || EIGHT_BYTE_ALIGNMENT( pRet->p ) );
  return pRet;
}